

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArgumentsObject.cpp
# Opt level: O0

BOOL __thiscall Js::HeapArgumentsObject::DeleteItemAt(HeapArgumentsObject *this,uint32 index)

{
  BOOLEAN BVar1;
  BVSparse<Memory::Recycler> **ppBVar2;
  ScriptContext *this_00;
  Recycler *pRVar3;
  BVSparse<Memory::Recycler> *pBVar4;
  TrackAllocData local_50;
  Recycler *local_28;
  Recycler *recycler;
  HeapArgumentsObject *pHStack_18;
  uint32 index_local;
  HeapArgumentsObject *this_local;
  
  if (index < this->formalCount) {
    recycler._4_4_ = index;
    pHStack_18 = this;
    ppBVar2 = Memory::WriteBarrierPtr::operator_cast_to_BVSparse__
                        ((WriteBarrierPtr *)&this->deletedArgs);
    if (*ppBVar2 == (BVSparse<Memory::Recycler> *)0x0) {
      this_00 = RecyclableObject::GetScriptContext((RecyclableObject *)this);
      pRVar3 = ScriptContext::GetRecycler(this_00);
      local_28 = pRVar3;
      Memory::TrackAllocData::CreateTrackAllocData
                (&local_50,(type_info *)&BVSparse<Memory::Recycler>::typeinfo,0,0xffffffffffffffff,
                 "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/ArgumentsObject.cpp"
                 ,0x9d);
      pRVar3 = Memory::Recycler::TrackAllocInfo(pRVar3,&local_50);
      pBVar4 = (BVSparse<Memory::Recycler> *)new<Memory::Recycler>(0x20,pRVar3,0x43c4b0);
      BVSparse<Memory::Recycler>::BVSparse(pBVar4,local_28);
      Memory::WriteBarrierPtr<BVSparse<Memory::Recycler>_>::operator=(&this->deletedArgs,pBVar4);
    }
    pBVar4 = Memory::WriteBarrierPtr<BVSparse<Memory::Recycler>_>::operator->(&this->deletedArgs);
    BVar1 = BVSparse<Memory::Recycler>::Test(pBVar4,recycler._4_4_);
    if (BVar1 == '\0') {
      pBVar4 = Memory::WriteBarrierPtr<BVSparse<Memory::Recycler>_>::operator->(&this->deletedArgs);
      BVSparse<Memory::Recycler>::Set(pBVar4,recycler._4_4_);
      return 1;
    }
  }
  return 0;
}

Assistant:

BOOL HeapArgumentsObject::DeleteItemAt(uint32 index)
    {
        if (index < formalCount)
        {
            if (this->deletedArgs == nullptr)
            {
                Recycler *recycler = GetScriptContext()->GetRecycler();
                deletedArgs = RecyclerNew(recycler, BVSparse<Recycler>, recycler);
            }

            if (!this->deletedArgs->Test(index))
            {
                this->deletedArgs->Set(index);
                return true;
            }
        }

        return false;
    }